

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O2

int Gia_SweeperProbeDelete(Gia_Man_t *p,int ProbeId)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = p->pData;
  iVar2 = Vec_IntEntry(*(Vec_Int_t **)((long)pvVar1 + 0x10),ProbeId);
  if (-1 < iVar2) {
    Vec_IntWriteEntry(*(Vec_Int_t **)((long)pvVar1 + 0x10),ProbeId,-1);
    return iVar2;
  }
  __assert_fail("iLit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                ,0x106,"int Gia_SweeperProbeDelete(Gia_Man_t *, int)");
}

Assistant:

int Gia_SweeperProbeDelete( Gia_Man_t * p, int ProbeId )
{
    Swp_Man_t * pSwp = (Swp_Man_t *)p->pData;
    int iLit = Vec_IntEntry(pSwp->vProbes, ProbeId);
    assert( iLit >= 0 );
    Vec_IntWriteEntry(pSwp->vProbes, ProbeId, -1);
    return iLit;
}